

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O1

int light_update_option(light_pcapng section,light_pcapng pcapng,light_option option)

{
  ushort uVar1;
  light_boolean lVar2;
  uint32_t *puVar3;
  uint uVar4;
  int iVar5;
  light_pcapng p_Var6;
  
  p_Var6 = pcapng;
  do {
    p_Var6 = (light_pcapng)p_Var6->options;
    if (p_Var6 == (light_pcapng)0x0) {
      iVar5 = light_add_option(section,pcapng,option,LIGHT_TRUE);
      return iVar5;
    }
  } while ((uint16_t)p_Var6->block_type != option->custom_option_code);
  uVar1 = *(uint16_t *)((long)&p_Var6->block_type + 2);
  if (uVar1 != option->option_length) {
    uVar4 = option->option_length + 3 & 0xfffc;
    iVar5 = uVar4 - (uVar1 + 3 & 0xfffc);
    pcapng->block_total_lenght = pcapng->block_total_lenght + iVar5;
    lVar2 = __is_section_header(section);
    if (lVar2 == LIGHT_TRUE) {
      *(long *)(section->block_body + 2) = *(long *)(section->block_body + 2) + (long)iVar5;
    }
    else {
      light_update_option_cold_1();
    }
    *(uint16_t *)((long)&p_Var6->block_type + 2) = option->option_length;
    free(p_Var6->block_body);
    puVar3 = (uint32_t *)calloc((ulong)uVar4,1);
    p_Var6->block_body = puVar3;
  }
  memcpy(p_Var6->block_body,option->data,(ulong)*(uint16_t *)((long)&p_Var6->block_type + 2));
  return 0;
}

Assistant:

int light_update_option(light_pcapng section, light_pcapng pcapng, light_option option)
{
	light_option iterator = pcapng->options;
	uint16_t old_data_size, new_data_size;

	while (iterator != NULL) {
		if (iterator->custom_option_code == option->custom_option_code) {
			break;
		}
		iterator = iterator->next_option;
	}

	if (iterator == NULL) {
		return light_add_option(section, pcapng, option, LIGHT_TRUE);
	}

	if (iterator->option_length != option->option_length) {
		PADD32(option->option_length, &new_data_size);
		PADD32(iterator->option_length, &old_data_size);

		int data_size_diff = (int)new_data_size - (int)old_data_size;
		pcapng->block_total_lenght += data_size_diff;

		if (__is_section_header(section) == 1) {
			struct _light_section_header *shb = (struct _light_section_header *)section->block_body;
			shb->section_length += data_size_diff;
		}
		else {
			PCAPNG_WARNING("PCAPNG block is not section header!");
		}

		iterator->option_length = option->option_length;
		free(iterator->data);
		iterator->data = calloc(new_data_size, sizeof(uint8_t));
	}

	memcpy(iterator->data, option->data, iterator->option_length);

	return LIGHT_SUCCESS;
}